

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

APlayerPawn * P_SpawnPlayer(FPlayerStart *mthing,int playernum,int flags)

{
  DWORD *pDVar1;
  player_t *player;
  double dVar2;
  byte bVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  APlayerPawn *pAVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  AInventory *pAVar11;
  DThinker *pDVar12;
  int ii;
  APlayerPawn *pAVar13;
  long lVar14;
  APlayerPawn *pAVar15;
  WORD type;
  ulong uVar16;
  int ii_1;
  DVector3 spawn;
  TThinkerIterator<AActor> it;
  double local_70;
  DVector3 local_68;
  DAngle local_50;
  FThinkerIterator local_48;
  
  if ((7 < (uint)playernum || mthing == (FPlayerStart *)0x0) ||
     (uVar16 = (ulong)(uint)playernum, playeringame[uVar16] != true)) {
    return (APlayerPawn *)0x0;
  }
  if (consoleplayer == playernum) {
    P_PredictionLerpReset();
  }
  lVar7 = uVar16 * 0x2a0;
  player = (player_t *)(&players + uVar16 * 0x54);
  if ((&DAT_017e5ea0)[uVar16 * 0x54] == 0) {
    if (PlayerClasses.Count < 2) {
      uVar5 = 0;
    }
    else if ((deathmatch.Value == 0) || (multiplayer == false)) {
      uVar5 = SinglePlayerClass[uVar16];
    }
    else {
      puVar10 = (undefined8 *)
                ((ulong)(((&DAT_017e5e98)[uVar16 * 0xa8] - 1 & 0x23c) * 0x18) +
                (&DAT_017e5e88)[uVar16 * 0x54]);
      do {
        puVar9 = puVar10;
        puVar10 = (undefined8 *)*puVar9;
      } while (*(int *)(puVar9 + 1) != 0x23c);
      uVar5 = *(uint *)(puVar9[2] + 0x28);
      if ((int)uVar5 < 0) {
        uVar5 = FRandom::GenRand32(&pr_multiclasschoice);
        uVar5 = (uVar5 & 0xff) % PlayerClasses.Count;
      }
    }
    (&DAT_017e5ef0)[lVar7] = (char)uVar5;
    (&DAT_017e5ea0)[uVar16 * 0x54] =
         *(undefined8 *)((long)&(PlayerClasses.Array)->Type + (ulong)((uVar5 & 0xff) << 5));
  }
  if (((((((dmflags2.Value._1_1_ & 0x10) == 0) || ((&DAT_017e5e58)[lVar7] != '\x02')) ||
        (deathmatch.Value != 0)) ||
       ((gameaction == ga_worlddone || (player->mo == (APlayerPawn *)0x0)))) ||
      ((((player->mo->super_AActor).Sector)->Flags & 8) != 0)) ||
     ((&DAT_017e5f80)[uVar16 * 0x54] == 0)) {
LAB_004284ac:
    local_68.X = (mthing->pos).X;
    local_68.Y = (mthing->pos).Y;
    local_70 = (double)(int)mthing->angle;
    if (((byte)i_compatflags2 & 1) != 0) {
      local_70 = local_70 + 0.01;
    }
    if ((*(byte *)(*(long *)((&DAT_017e5ea0)[uVar16 * 0x54] + 0xe8) + 0x1bd) & 1) == 0) {
      if ((*(byte *)(*(long *)((&DAT_017e5ea0)[uVar16 * 0x54] + 0xe8) + 0x1c0) & 0x40) == 0) {
        local_68.Z = -2147483648.0;
      }
      else {
        local_68.Z = 2147483646.0;
      }
    }
    else {
      local_68.Z = 2147483647.0;
    }
  }
  else {
    if ((*(byte *)((&DAT_017e5f80)[uVar16 * 0x54] + 0x20) & 0x20) != 0) {
      (&DAT_017e5f80)[uVar16 * 0x54] = 0;
      goto LAB_004284ac;
    }
    pAVar8 = player->mo;
    if (999999 < ((pAVar8->super_AActor).Sector)->damageamount) goto LAB_004284ac;
    local_68.X = (pAVar8->super_AActor).__Pos.X;
    local_68.Y = (pAVar8->super_AActor).__Pos.Y;
    local_68.Z = (pAVar8->super_AActor).__Pos.Z;
    local_70 = (pAVar8->super_AActor).Angles.Yaw.Degrees;
  }
  pAVar8 = (APlayerPawn *)
           AActor::StaticSpawn((PClassActor *)(&DAT_017e5ea0)[uVar16 * 0x54],&local_68,NO_REPLACE,
                               false);
  if ((level.flags._3_1_ & 8) != 0) {
    if ((local_68.Z != -2147483648.0) || (NAN(local_68.Z))) {
      if ((local_68.Z == 2147483647.0) && (!NAN(local_68.Z))) {
        dVar4 = (pAVar8->super_AActor).__Pos.Z - (mthing->pos).Z;
        goto LAB_0042858c;
      }
    }
    else {
      dVar4 = (mthing->pos).Z + (pAVar8->super_AActor).__Pos.Z;
LAB_0042858c:
      (pAVar8->super_AActor).__Pos.Z = dVar4;
    }
    P_FindFloorCeiling((AActor *)pAVar8,0xe);
  }
  (pAVar8->super_AActor).FriendPlayer = (char)playernum + '\x01';
  pAVar15 = player->mo;
  player->mo = pAVar8;
  (pAVar8->super_AActor).player = player;
  bVar3 = (&DAT_017e5e58)[lVar7];
  if ((bVar3 & 0xfe) == 2) {
    G_PlayerReborn(playernum);
  }
  else if (((pAVar15 != (APlayerPawn *)0x0) && ((flags & 1U) == 0)) &&
          ((pAVar15->super_AActor).player == player)) {
    AActor::ObtainInventory((AActor *)pAVar8,&pAVar15->super_AActor);
    FBehavior::StaticStopMyScripts(&pAVar15->super_AActor);
  }
  puVar10 = (undefined8 *)
            ((ulong)(((&DAT_017e5e98)[uVar16 * 0xa8] - 1 & 0x208) * 0x18) +
            (&DAT_017e5e88)[uVar16 * 0x54]);
  do {
    puVar9 = puVar10;
    puVar10 = (undefined8 *)*puVar9;
  } while (*(int *)(puVar9 + 1) != 0x208);
  iVar6 = R_FindSkin(skins[*(int *)(puVar9[2] + 0x28)].name,(uint)(byte)(&DAT_017e5ef0)[lVar7]);
  userinfo_t::SkinNumChanged((userinfo_t *)(&DAT_017e5e88 + uVar16 * 0x54),iVar6);
  if (((pAVar8->super_AActor).flags2.Value & 0x10000) == 0) {
    R_BuildPlayerTranslation(playernum);
    (pAVar8->super_AActor).Translation = playernum | 0x10000;
  }
  (pAVar8->super_AActor).Angles.Yaw.Degrees = local_70;
  (pAVar8->super_AActor).Angles.Roll.Degrees = 0.0;
  (pAVar8->super_AActor).Angles.Pitch.Degrees = 0.0;
  (pAVar8->super_AActor).health = (&DAT_017e5ee8)[uVar16 * 0xa8];
  if (((pAVar8->super_AActor).flags4.Value & 0x20) == 0) {
    puVar10 = (undefined8 *)
              ((ulong)(((&DAT_017e5e98)[uVar16 * 0xa8] - 1 & 0x208) * 0x18) +
              (&DAT_017e5e88)[uVar16 * 0x54]);
    do {
      puVar9 = puVar10;
      puVar10 = (undefined8 *)*puVar9;
    } while (*(int *)(puVar9 + 1) != 0x208);
    (pAVar8->super_AActor).sprite = skins[*(int *)(puVar9[2] + 0x28)].sprite;
  }
  *(undefined8 *)(&DAT_017e5ea8 + uVar16 * 0xa8) = 0x42b4000042b40000;
  pAVar13 = player->mo;
  (&DAT_017e5fc8)[uVar16 * 0x54] = pAVar13;
  (&DAT_017e5e58)[lVar7] = 0;
  *(undefined2 *)(&DAT_017e5f40 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e5f54 + lVar7) = 0;
  (&DAT_017e5f90)[uVar16 * 0xa8] = 0;
  *(undefined8 *)(&DAT_017e5f98 + lVar7) = 0;
  *(undefined4 *)(&DAT_017e5fa0 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e5fa8 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e5f88 + lVar7) = 0xffffffff00000000;
  (&DAT_017e5eb8)[uVar16 * 0x54] = pAVar8->ViewHeight;
  (&DAT_017e5f42)[uVar16 * 0x150] = 0;
  (&DAT_017e5f80)[uVar16 * 0x54] = 0;
  *(undefined2 *)(&DAT_017e5f1c + lVar7) = 0;
  *(undefined4 *)(&DAT_017e5f18 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e5ff0 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e5ff8 + lVar7) = 0;
  APlayerPawn::ResetAirSupply(pAVar13,false);
  if (((double)(&DAT_017e6018)[uVar16 * 0x54] != 1.0) ||
     (NAN((double)(&DAT_017e6018)[uVar16 * 0x54]))) {
    (&DAT_017e6018)[uVar16 * 0x54] = 0x3ff0000000000000;
    (&DAT_017e5fe2)[uVar16 * 0x150] = 0;
    *(undefined8 *)(&DAT_017e6020 + lVar7) = 0;
    *(undefined8 *)(lVar7 + 0x17e6028) = 0;
    (&DAT_017e5eb8)[uVar16 * 0x54] = player->mo->ViewHeight;
  }
  *(undefined8 *)(&DAT_017e5fd8 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e6008 + lVar7) = 0;
  *(undefined8 *)(&DAT_017e6010 + lVar7) = 0;
  (&DAT_017e5fe0)[lVar7] = 0xff;
  *(undefined8 *)(&DAT_017e5ed0 + lVar7) = 0;
  *(undefined8 *)(lVar7 + 0x17e5ed8) = 0;
  puVar10 = &DAT_017e5fc8;
  lVar7 = 0;
  do {
    if (playeringame[lVar7] == true) {
      pAVar13 = (APlayerPawn *)*puVar10;
      if ((pAVar13 != (APlayerPawn *)0x0) &&
         (((pAVar13->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        *puVar10 = 0;
        pAVar13 = (APlayerPawn *)0x0;
      }
      if (pAVar13 == pAVar15) {
        *puVar10 = pAVar8;
      }
    }
    lVar7 = lVar7 + 1;
    puVar10 = puVar10 + 0x54;
  } while (lVar7 != 8);
  if (((demoplayback != false) || (demonew == true)) && (chasedemo.Value == true)) {
    (&DAT_017e5f38)[uVar16 * 0xa8] = 0x20;
  }
  if ((flags & 1U) == 0) {
    P_SetupPsprites(player,SUB41((flags & 2U) >> 1,0));
  }
  if (deathmatch.Value == 0) {
    if ((multiplayer == false) && ((level.flags2._2_1_ & 2) == 0)) {
      if ((bVar3 == 2 & sv_singleplayerrespawn.Value & pAVar15 != (APlayerPawn *)0x0) == 0)
      goto LAB_004288e0;
    }
    else if (pAVar15 == (APlayerPawn *)0x0 || bVar3 != 2) goto LAB_004288e0;
    APlayerPawn::FilterCoopRespawnInventory(player->mo,pAVar15);
  }
  else {
    APlayerPawn::GiveDeathmatchInventory(player->mo);
  }
LAB_004288e0:
  if (pAVar15 != (APlayerPawn *)0x0) {
    AActor::DestroyAllInventory(&pAVar15->super_AActor);
  }
  if ((((bVar3 & 0xfe) == 2) && ((dmflags2.Value._1_1_ & 4) != 0)) &&
     ((multiplayer != false || (alwaysapplydmflags.Value == true)))) {
    pAVar11 = AActor::GiveInventoryType
                        (&player->mo->super_AActor,
                         (PClassActor *)APowerInvulnerable::RegistrationInfo.MyClass);
    *(undefined8 *)&pAVar11->field_0x4fc = 0x69;
    *(byte *)&pAVar11->ItemFlags = (byte)pAVar11->ItemFlags | 0x20;
    pDVar1 = &(player->mo->super_AActor).effects;
    *pDVar1 = *pDVar1 | 0x20;
  }
  if ((StatusBar != (DBaseStatusBar *)0x0) &&
     ((consoleplayer == playernum ||
      (iVar6 = DBaseStatusBar::GetPlayer(StatusBar), iVar6 == playernum)))) {
    (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,player);
  }
  if (multiplayer == true) {
    local_50.Degrees = (pAVar8->super_AActor).Angles.Yaw.Degrees;
    AActor::Vec3Angle((DVector3 *)&local_48,(AActor *)pAVar8,20.0,&local_50,0.0,false);
    P_SpawnTeleportFog((AActor *)pAVar8,(DVector3 *)&local_48,false,true);
  }
  dVar4 = (pAVar8->super_AActor).ceilingz;
  dVar2 = (pAVar8->super_AActor).Height;
  if (dVar4 < (pAVar8->super_AActor).__Pos.Z + dVar2) {
    (pAVar8->super_AActor).__Pos.Z = dVar4 - dVar2;
  }
  if ((flags & 1U) == 0) {
    if ((bVar3 == 3) || ((bVar3 == 0 && (savegamerestore == false)))) {
      pAVar15 = player->mo;
      type = 4;
    }
    else {
      if (bVar3 != 2) {
        return pAVar8;
      }
      if (pAVar15 == (APlayerPawn *)0x0) {
        __assert_fail("oldactor != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x147a,"APlayerPawn *P_SpawnPlayer(FPlayerStart *, int, int)");
      }
      FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
      pDVar12 = FThinkerIterator::Next(&local_48,false);
      if (pDVar12 != (DThinker *)0x0) {
        do {
          pAVar13 = *(APlayerPawn **)&pDVar12[9].super_DObject.ObjectFlags;
          if ((pAVar13 != (APlayerPawn *)0x0) &&
             (((pAVar13->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
            *(undefined8 *)&pDVar12[9].super_DObject.ObjectFlags = 0;
            pAVar13 = (APlayerPawn *)0x0;
          }
          if (pAVar13 == pAVar15) {
            *(undefined8 *)&pDVar12[9].super_DObject.ObjectFlags = 0;
          }
          pDVar12 = FThinkerIterator::Next(&local_48,false);
        } while (pDVar12 != (DThinker *)0x0);
      }
      if (0 < numsectors) {
        lVar7 = 0x108;
        lVar14 = 0;
        do {
          pAVar13 = *(APlayerPawn **)((long)&sectors->planes[0].xform.xOffs + lVar7);
          if ((pAVar13 != (APlayerPawn *)0x0) &&
             (((pAVar13->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
            *(undefined8 *)((long)&sectors->planes[0].xform.xOffs + lVar7) = 0;
            pAVar13 = (APlayerPawn *)0x0;
          }
          if (pAVar13 == pAVar15) {
            *(undefined8 *)((long)&sectors->planes[0].xform.xOffs + lVar7) = 0;
          }
          lVar14 = lVar14 + 1;
          lVar7 = lVar7 + 0x218;
        } while (lVar14 < numsectors);
      }
      lVar7 = 0;
      DObject::StaticPointerSubstitution((DObject *)pAVar15,(DObject *)player->mo,false);
      pAVar13 = player->mo;
      do {
        if ((APlayerPawn *)bodyque[lVar7] == pAVar13) {
          bodyque[lVar7] = &pAVar15->super_AActor;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      pAVar15 = player->mo;
      type = 2;
    }
    FBehavior::StaticStartTypedScripts(type,&pAVar15->super_AActor,true,0,false);
  }
  return pAVar8;
}

Assistant:

APlayerPawn *P_SpawnPlayer (FPlayerStart *mthing, int playernum, int flags)
{
	player_t *p;
	APlayerPawn *mobj, *oldactor;
	BYTE	  state;
	DVector3 spawn;
	DAngle SpawnAngle;

	if (mthing == NULL)
	{
		return NULL;
	}
	// not playing?
	if ((unsigned)playernum >= (unsigned)MAXPLAYERS || !playeringame[playernum])
		return NULL;

	// Old lerp data needs to go
	if (playernum == consoleplayer)
	{
		P_PredictionLerpReset();
	}

	p = &players[playernum];

	if (p->cls == NULL)
	{
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			int type;

			if (!deathmatch || !multiplayer)
			{
				type = SinglePlayerClass[playernum];
			}
			else
			{
				type = p->userinfo.GetPlayerClassNum();
				if (type < 0)
				{
					type = pr_multiclasschoice() % PlayerClasses.Size ();
				}
			}
			p->CurrentPlayerClass = type;
		}
		else
		{
			p->CurrentPlayerClass = 0;
		}
		p->cls = PlayerClasses[p->CurrentPlayerClass].Type;
	}

	if (( dmflags2 & DF2_SAME_SPAWN_SPOT ) &&
		( p->playerstate == PST_REBORN ) &&
		( deathmatch == false ) &&
		( gameaction != ga_worlddone ) &&
		( p->mo != NULL ) && 
		( !(p->mo->Sector->Flags & SECF_NORESPAWN) ) &&
		( NULL != p->attacker ) &&							// don't respawn on damaging floors
		( p->mo->Sector->damageamount < TELEFRAG_DAMAGE ))	// this really should be a bit smarter...
	{
		spawn = p->mo->Pos();
		SpawnAngle = p->mo->Angles.Yaw;
	}
	else
	{
		spawn.X = mthing->pos.X;
		spawn.Y = mthing->pos.Y;

		// Allow full angular precision
		SpawnAngle = (double)mthing->angle;
		if (i_compatflags2 & COMPATF2_BADANGLES)
		{
			SpawnAngle += 0.01;
		}

		if (GetDefaultByType(p->cls)->flags & MF_SPAWNCEILING)
			spawn.Z = ONCEILINGZ;
		else if (GetDefaultByType(p->cls)->flags2 & MF2_SPAWNFLOAT)
			spawn.Z = FLOATRANDZ;
		else
			spawn.Z = ONFLOORZ;
	}

	mobj = static_cast<APlayerPawn *>
		(Spawn (p->cls, spawn, NO_REPLACE));

	if (level.flags & LEVEL_USEPLAYERSTARTZ)
	{
		if (spawn.Z == ONFLOORZ)
			mobj->AddZ(mthing->pos.Z);
		else if (spawn.Z == ONCEILINGZ)
			mobj->AddZ(-mthing->pos.Z);
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	mobj->FriendPlayer = playernum + 1;	// [RH] players are their own friends
	oldactor = p->mo;
	p->mo = mobj;
	mobj->player = p;
	state = p->playerstate;
	if (state == PST_REBORN || state == PST_ENTER)
	{
		G_PlayerReborn (playernum);
	}
	else if (oldactor != NULL && oldactor->player == p && !(flags & SPF_TEMPPLAYER))
	{
		// Move the voodoo doll's inventory to the new player.
		mobj->ObtainInventory (oldactor);
		FBehavior::StaticStopMyScripts (oldactor);	// cancel all ENTER/RESPAWN scripts for the voodoo doll
	}

	// [GRB] Reset skin
	p->userinfo.SkinNumChanged(R_FindSkin (skins[p->userinfo.GetSkin()].name, p->CurrentPlayerClass));

	if (!(mobj->flags2 & MF2_DONTTRANSLATE))
	{
		// [RH] Be sure the player has the right translation
		R_BuildPlayerTranslation (playernum);

		// [RH] set color translations for player sprites
		mobj->Translation = TRANSLATION(TRANSLATION_Players,playernum);
	}

	mobj->Angles.Yaw = SpawnAngle;
	mobj->Angles.Pitch = mobj->Angles.Roll = 0.;
	mobj->health = p->health;

	// [RH] Set player sprite based on skin
	if (!(mobj->flags4 & MF4_NOSKIN))
	{
		mobj->sprite = skins[p->userinfo.GetSkin()].sprite;
	}

	p->DesiredFOV = p->FOV = 90.f;
	p->camera = p->mo;
	p->playerstate = PST_LIVE;
	p->refire = 0;
	p->damagecount = 0;
	p->bonuscount = 0;
	p->morphTics = 0;
	p->MorphedPlayerClass = 0;
	p->MorphStyle = 0;
	p->MorphExitFlash = NULL;
	p->extralight = 0;
	p->fixedcolormap = NOFIXEDCOLORMAP;
	p->fixedlightlevel = -1;
	p->viewheight = mobj->ViewHeight;
	p->inconsistant = 0;
	p->attacker = NULL;
	p->spreecount = 0;
	p->multicount = 0;
	p->lastkilltime = 0;
	p->BlendR = p->BlendG = p->BlendB = p->BlendA = 0.f;
	p->mo->ResetAirSupply(false);
	p->Uncrouch();
	p->MinPitch = p->MaxPitch = 0.;	// will be filled in by PostBeginPlay()/netcode
	p->MUSINFOactor = NULL;
	p->MUSINFOtics = -1;

	p->Vel.Zero();	// killough 10/98: initialize bobbing to 0.

	for (int ii = 0; ii < MAXPLAYERS; ++ii)
	{
		if (playeringame[ii] && players[ii].camera == oldactor)
		{
			players[ii].camera = mobj;
		}
	}

	// [RH] Allow chasecam for demo watching
	if ((demoplayback || demonew) && chasedemo)
		p->cheats = CF_CHASECAM;

	// setup gun psprite
	if (!(flags & SPF_TEMPPLAYER))
	{ // This can also start a script so don't do it for the dummy player.
		P_SetupPsprites (p, !!(flags & SPF_WEAPONFULLYUP));
	}

	if (deathmatch)
	{ // Give all cards in death match mode.
		p->mo->GiveDeathmatchInventory ();
	}
	else if ((multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN) || sv_singleplayerrespawn) && state == PST_REBORN && oldactor != NULL)
	{ // Special inventory handling for respawning in coop
		p->mo->FilterCoopRespawnInventory (oldactor);
	}
	if (oldactor != NULL)
	{ // Remove any inventory left from the old actor. Coop handles
	  // it above, but the other modes don't.
		oldactor->DestroyAllInventory();
	}
	// [BC] Handle temporary invulnerability when respawned
	if ((state == PST_REBORN || state == PST_ENTER) &&
		(dmflags2 & DF2_YES_RESPAWN_INVUL) &&
		(multiplayer || alwaysapplydmflags))
	{
		APowerup *invul = static_cast<APowerup*>(p->mo->GiveInventoryType (RUNTIME_CLASS(APowerInvulnerable)));
		invul->EffectTics = 3*TICRATE;
		invul->BlendColor = 0;			// don't mess with the view
		invul->ItemFlags |= IF_UNDROPPABLE;	// Don't drop this
		p->mo->effects |= FX_RESPAWNINVUL;	// [RH] special effect
	}

	if (StatusBar != NULL && (playernum == consoleplayer || StatusBar->GetPlayer() == playernum))
	{
		StatusBar->AttachToPlayer (p);
	}

	if (multiplayer)
	{
		P_SpawnTeleportFog(mobj, mobj->Vec3Angle(20., mobj->Angles.Yaw, 0.), false, true);
	}

	// "Fix" for one of the starts on exec.wad MAP01: If you start inside the ceiling,
	// drop down below it, even if that means sinking into the floor.
	if (mobj->Top() > mobj->ceilingz)
	{
		mobj->SetZ(mobj->ceilingz - mobj->Height, false);
	}

	// [BC] Do script stuff
	if (!(flags & SPF_TEMPPLAYER))
	{
		if (state == PST_ENTER || (state == PST_LIVE && !savegamerestore))
		{
			FBehavior::StaticStartTypedScripts (SCRIPT_Enter, p->mo, true);
		}
		else if (state == PST_REBORN)
		{
			assert (oldactor != NULL);

			// before relocating all pointers to the player all sound targets
			// pointing to the old actor have to be NULLed. Otherwise all
			// monsters who last targeted this player will wake up immediately
			// after the player has respawned.
			AActor *th;
			TThinkerIterator<AActor> it;
			while ((th = it.Next()))
			{
				if (th->LastHeard == oldactor) th->LastHeard = NULL;
			}
			for(int i = 0; i < numsectors; i++)
			{
				if (sectors[i].SoundTarget == oldactor) sectors[i].SoundTarget = NULL;
			}

			DObject::StaticPointerSubstitution (oldactor, p->mo);
			// PointerSubstitution() will also affect the bodyque, so undo that now.
			for (int ii=0; ii < BODYQUESIZE; ++ii)
				if (bodyque[ii] == p->mo)
					bodyque[ii] = oldactor;
			FBehavior::StaticStartTypedScripts (SCRIPT_Respawn, p->mo, true);
		}
	}
	return mobj;
}